

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O0

void Ins_UNKNOWN(TT_ExecContext exc)

{
  int iVar1;
  TT_DefArray pTVar2;
  TT_CallStack pTVar3;
  TT_CallRec *call;
  TT_DefRecord *limit;
  TT_DefRecord *def;
  TT_ExecContext exc_local;
  
  limit = exc->IDefs;
  pTVar2 = limit + exc->numIDefs;
  while( true ) {
    if (pTVar2 <= limit) {
      exc->error = 0x80;
      return;
    }
    if (((limit->opc & 0xff) == (uint)exc->opcode) && (limit->active != '\0')) break;
    limit = limit + 1;
  }
  if (exc->callSize <= exc->callTop) {
    exc->error = 0x82;
    return;
  }
  iVar1 = exc->callTop;
  exc->callTop = iVar1 + 1;
  pTVar3 = exc->callStack + iVar1;
  pTVar3->Caller_Range = exc->curRange;
  pTVar3->Caller_IP = exc->IP + 1;
  pTVar3->Cur_Count = 1;
  pTVar3->Def = limit;
  Ins_Goto_CodeRange(exc,limit->range,limit->start);
  exc->step_ins = '\0';
  return;
}

Assistant:

static void
  Ins_UNKNOWN( TT_ExecContext  exc )
  {
    TT_DefRecord*  def   = exc->IDefs;
    TT_DefRecord*  limit = def + exc->numIDefs;


    for ( ; def < limit; def++ )
    {
      if ( (FT_Byte)def->opc == exc->opcode && def->active )
      {
        TT_CallRec*  call;


        if ( exc->callTop >= exc->callSize )
        {
          exc->error = FT_THROW( Stack_Overflow );
          return;
        }

        call = exc->callStack + exc->callTop++;

        call->Caller_Range = exc->curRange;
        call->Caller_IP    = exc->IP + 1;
        call->Cur_Count    = 1;
        call->Def          = def;

        Ins_Goto_CodeRange( exc, def->range, def->start );

        exc->step_ins = FALSE;
        return;
      }
    }

    exc->error = FT_THROW( Invalid_Opcode );
  }